

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

ptAttValComparator GetAttValComparator(TidyAttrSortStrategy strat,ctmbstr *list)

{
  ctmbstr *list_local;
  code *pcStack_10;
  TidyAttrSortStrategy strat_local;
  
  if (strat == TidySortAttrNone) {
    if ((list != (ctmbstr *)0x0) && (*list != (ctmbstr)0x0)) {
      pcStack_10 = PriorityComparator;
      return pcStack_10;
    }
  }
  else if (strat == TidySortAttrAlpha) {
    pcStack_10 = AlphaComparator;
    return pcStack_10;
  }
  return (ptAttValComparator)0x0;
}

Assistant:

static
ptAttValComparator GetAttValComparator(TidyAttrSortStrategy strat, ctmbstr *list)
{
    switch (strat)
    {
    case TidySortAttrAlpha:
        return AlphaComparator;
    case TidySortAttrNone:
        if ( list && list[0] )
            return PriorityComparator;
        break;
    }
    return 0;
}